

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_StringUtilities.cpp
# Opt level: O3

string * soul::padded(string *__return_storage_ptr__,string *s,int minSize)

{
  long lVar1;
  long *plVar2;
  size_t in_RCX;
  size_type *psVar3;
  int iVar4;
  string local_38;
  
  iVar4 = minSize - (int)s->_M_string_length;
  if (iVar4 < 2) {
    iVar4 = 1;
  }
  repeatedCharacter_abi_cxx11_(&local_38,(soul *)0x20,(char)iVar4,in_RCX);
  plVar2 = (long *)std::__cxx11::string::replace
                             ((ulong)&local_38,0,(char *)0x0,(ulong)(s->_M_dataplus)._M_p);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar3 = (size_type *)(plVar2 + 2);
  if ((size_type *)*plVar2 == psVar3) {
    lVar1 = plVar2[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar3;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar1;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar2;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar3;
  }
  __return_storage_ptr__->_M_string_length = plVar2[1];
  *plVar2 = (long)psVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string padded (const std::string& s, int minSize)
{
    auto extraNeeded = std::max (1, minSize - (int) s.length());
    return s + repeatedCharacter (' ', (size_t) extraNeeded);
}